

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O0

void __thiscall PropertyDef::~PropertyDef(PropertyDef *this)

{
  QByteArray::~QByteArray((QByteArray *)0x13bc43);
  QByteArray::~QByteArray((QByteArray *)0x13bc54);
  QByteArray::~QByteArray((QByteArray *)0x13bc65);
  QByteArray::~QByteArray((QByteArray *)0x13bc76);
  QByteArray::~QByteArray((QByteArray *)0x13bc87);
  QByteArray::~QByteArray((QByteArray *)0x13bc98);
  QByteArray::~QByteArray((QByteArray *)0x13bca9);
  QByteArray::~QByteArray((QByteArray *)0x13bcb7);
  QByteArray::~QByteArray((QByteArray *)0x13bcc5);
  QByteArray::~QByteArray((QByteArray *)0x13bcd3);
  QByteArray::~QByteArray((QByteArray *)0x13bce1);
  QByteArray::~QByteArray((QByteArray *)0x13bcef);
  QByteArray::~QByteArray((QByteArray *)0x13bcf9);
  return;
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }